

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O2

InsertResult * __thiscall
stick::HashMap<stick::String,_unsigned_long,_stick::DefaultHash>::insert
          (InsertResult *__return_storage_ptr__,
          HashMap<stick::String,_unsigned_long,_stick::DefaultHash> *this,KeyValuePair *_val)

{
  Size _bucketIdx;
  Node **ppNVar1;
  ulong uVar2;
  bool bVar3;
  float fVar4;
  KeyValuePair local_70;
  Bucket *local_48;
  Node *local_40;
  Node *prev;
  Node *n;
  
  _bucketIdx = bucketIndex(this,&_val->key);
  local_48 = this->m_buckets;
  findHelper(this,_bucketIdx,&_val->key,&prev,&local_40);
  if (prev == (Node *)0x0) {
    String::String(&local_70.key,&_val->key);
    local_70.value = _val->value;
    prev = createNode(this,&local_70,_bucketIdx);
    String::deallocate(&local_70.key);
    if (local_40 == (Node *)0x0) {
      ppNVar1 = &local_48[_bucketIdx].first;
    }
    else {
      prev->prev = local_40;
      ppNVar1 = &local_40->next;
    }
    *ppNVar1 = prev;
    uVar2 = this->m_count + 1;
    this->m_count = uVar2;
    fVar4 = (float)uVar2 / (float)this->m_bucketCount;
    bVar3 = true;
    if ((float)this->m_maxLoadFactor <= fVar4 && fVar4 != (float)this->m_maxLoadFactor) {
      rehash(this,this->m_bucketCount * 2);
    }
  }
  else {
    if (local_40 != prev->prev) {
      __assert_fail("prev == n->prev",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/HashMap.hpp"
                    ,0x161,
                    "InsertResult stick::HashMap<stick::String, unsigned long>::insert(KeyValuePair &&) [K = stick::String, V = unsigned long, H = stick::DefaultHash]"
                   );
    }
    (prev->kv).value = _val->value;
    bVar3 = false;
  }
  (__return_storage_ptr__->iterator).map = this;
  (__return_storage_ptr__->iterator).bucketIndex = _bucketIdx;
  (__return_storage_ptr__->iterator).node = prev;
  __return_storage_ptr__->inserted = bVar3;
  return __return_storage_ptr__;
}

Assistant:

inline InsertResult insert(KeyValuePair && _val)
    {
        Size bi = bucketIndex(_val.key);
        Bucket & b = m_buckets[bi];

        // check if the key allready exists
        Node *n, *prev;
        findHelper(bi, _val.key, n, prev);

        // the key allready exists, change the value
        if (n)
        {
            STICK_ASSERT(prev == n->prev);
            n->kv.value = std::move(_val.value);
            return { Iter(*this, bi, n), false };
        }
        else
        {
            // otherwise create the node n stuff
            n = createNode({ _val.key, std::move(_val.value) }, bi);
            if (prev)
            {
                n->prev = prev;
                prev->next = n;
            }
            else
            {
                b.first = n;
            }
            ++m_count;
        }

        Float32 lf = loadFactor();
        if (lf > m_maxLoadFactor)
        {
            rehash(m_bucketCount * 2);
        }

        return { Iter(*this, bi, n), true };
    }